

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall Clasp::DefaultUnfoundedCheck::reset(DefaultUnfoundedCheck *this)

{
  uint32 uVar1;
  long in_RDI;
  
  uVar1 = Solver::decisionLevel((Solver *)0x20f11c);
  if (uVar1 != 0) {
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x78));
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::reset() {
	assert(loopAtoms_.empty() && sourceQ_.empty() && ufs_.empty() && todo_.empty());
	// remember assignments from top-level -
	// the reset may come from a stop request and we might
	// want to continue later
	if (solver_->decisionLevel()) {
		invalidQ_.clear();
	}
}